

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall DivideTest<unsigned_long>::run(DivideTest<unsigned_long> *this)

{
  int i_1;
  UT bits;
  unsigned_long denom_1;
  int j;
  int i;
  UT denom;
  set_t<unsigned_long> tested_denom;
  UT in_stack_ffffffffffffff78;
  DivideTest<unsigned_long> *in_stack_ffffffffffffff80;
  undefined4 local_6c;
  undefined8 local_68;
  set_t<unsigned_long> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar1;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 local_40;
  
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x128266);
  for (local_40 = 1; local_40 < 0x400; local_40 = local_40 + 1) {
    test_both_signs(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                    (set_t<unsigned_long> *)0x12828e);
  }
  std::numeric_limits<unsigned_long>::max();
  test_all_algorithms((DivideTest<unsigned_long> *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      in_stack_ffffffffffffffa0);
  for (iVar1 = 1; iVar1 < 0x40; iVar1 = iVar1 + 1) {
    for (in_stack_ffffffffffffffac = -1; in_stack_ffffffffffffffac < 2;
        in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1) {
      in_stack_ffffffffffffffa0 =
           (set_t<unsigned_long> *)
           ((1L << ((ulong)(byte)iVar1 & 0x3f)) + (long)in_stack_ffffffffffffffac);
      test_both_signs(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                      (set_t<unsigned_long> *)0x128327);
    }
  }
  for (local_68 = std::numeric_limits<unsigned_long>::max(); local_68 != 0; local_68 = local_68 << 1
      ) {
    test_all_algorithms((DivideTest<unsigned_long> *)CONCAT44(in_stack_ffffffffffffffb4,iVar1),
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffa0);
  }
  for (local_6c = 0; local_6c < 10000; local_6c = local_6c + 1) {
    in_stack_ffffffffffffff80 =
         (DivideTest<unsigned_long> *)random_denominator(in_stack_ffffffffffffff80);
    test_all_algorithms((DivideTest<unsigned_long> *)CONCAT44(in_stack_ffffffffffffffb4,iVar1),
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffa0);
  }
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x1283d2);
  return;
}

Assistant:

void run() {
        set_t<T> tested_denom;

        // Test small values
#if defined(__AVR__)
        UT primes[] = {2, 3, 5, 7, 11, 13, 17, 19, 23, 29, 31, 37, 41, 43, 47, 53, 59, 61, 67, 71,
            73, 79, 83, 89, 97, 101, 103, 107, 109, 113, 127, 131, 137, 139, 149, 151, 157, 163,
            167, 173};
        for (size_t index = 0; index < sizeof(primes) / sizeof(primes[0]); ++index) {
            test_both_signs(primes[index], tested_denom);
        }
#else
        for (UT denom = 1; denom < 1024; ++denom) {
            test_both_signs(denom, tested_denom);
        }
#endif

        if (limits::is_signed) {
            PRINT_PROGRESS_MSG(F("Testing minimum\n"));
            test_all_algorithms((limits::min)(), tested_denom);
        }

        PRINT_PROGRESS_MSG(F("Testing maximum\n"));
        test_all_algorithms((limits::max)(), tested_denom);

        // test power of 2 denoms: 2^i-1, 2^i, 2^i+1
        PRINT_PROGRESS_MSG(F("Testing powers of 2\n"));
        for (int i = 1; i < limits::digits; i++) {
            for (int j = -1; j <= 1; j++) {
                T denom = static_cast<UT>((static_cast<T>(1) << i) + j);

                test_both_signs(denom, tested_denom);
            }
        }

        // test all bits set:
        // 11111111, 11111110, 11111100, ...
        PRINT_PROGRESS_MSG(F("Testing all bits set\n"));
        // For signed types, this degenerates to negative powers of
        // 2 (-1, -2, -4....): since we just tested those (above), skip.
        if (!limits::is_signed) {
            for (UT bits = (std::numeric_limits<UT>::max)(); bits != 0; bits <<= 1) {
                PRINT_PROGRESS_MSG((T)bits);
                PRINT_PROGRESS_MSG("\n");
                test_all_algorithms((T)bits, tested_denom);
            }
        }

        // Test random denominators
#if !defined(__AVR__)
        PRINT_PROGRESS_MSG(F("Test random denominators\n"));
        for (int i = 0; i < 10000; ++i) {
            test_all_algorithms(random_denominator(), tested_denom);
        }
#endif
    }